

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O3

Bitset * __thiscall
spirv_cross::ParsedIR::get_buffer_block_flags
          (Bitset *__return_storage_ptr__,ParsedIR *this,SPIRVariable *var)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  SPIRType *type;
  Meta *pMVar1;
  __hashtable *__h;
  __node_base _Var2;
  Bitset all_members_flags;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_70;
  Bitset local_68;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->ids).super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(var->super_IVariant).field_0xc);
  if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
    __return_storage_ptr__->lower = 0;
    this_00 = &__return_storage_ptr__->higher;
    (__return_storage_ptr__->higher)._M_h._M_buckets =
         &(__return_storage_ptr__->higher)._M_h._M_single_bucket;
    (__return_storage_ptr__->higher)._M_h._M_bucket_count = 1;
    (__return_storage_ptr__->higher)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->higher)._M_h._M_element_count = 0;
    (__return_storage_ptr__->higher)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (__return_storage_ptr__->higher)._M_h._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->higher)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    pMVar1 = find_meta(this,(ID)(var->super_IVariant).self.id);
    if ((pMVar1 != (Meta *)0x0) &&
       (__return_storage_ptr__->lower = (pMVar1->decoration).decoration_flags.lower,
       &(pMVar1->decoration).decoration_flags != __return_storage_ptr__)) {
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)this_00,&(pMVar1->decoration).decoration_flags.higher._M_h);
    }
    if ((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size != 0) {
      get_buffer_block_type_flags(&local_68,this,type);
      __return_storage_ptr__->lower = __return_storage_ptr__->lower | local_68.lower;
      if (local_68.higher._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        _Var2._M_nxt = local_68.higher._M_h._M_before_begin._M_nxt;
        do {
          local_70 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)this_00;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)this_00,_Var2._M_nxt + 1,&local_70);
          _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt;
        } while (_Var2._M_nxt != (_Hash_node_base *)0x0);
      }
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_68.higher._M_h);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("type.basetype == SPIRType::Struct",
                "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                ,0x237,
                "Bitset spirv_cross::ParsedIR::get_buffer_block_flags(const SPIRVariable &) const");
}

Assistant:

Bitset ParsedIR::get_buffer_block_flags(const SPIRVariable &var) const
{
	auto &type = get<SPIRType>(var.basetype);
	assert(type.basetype == SPIRType::Struct);

	// Some flags like non-writable, non-readable are actually found
	// as member decorations. If all members have a decoration set, propagate
	// the decoration up as a regular variable decoration.
	Bitset base_flags;
	auto *m = find_meta(var.self);
	if (m)
		base_flags = m->decoration.decoration_flags;

	if (type.member_types.empty())
		return base_flags;

	auto all_members_flags = get_buffer_block_type_flags(type);
	base_flags.merge_or(all_members_flags);
	return base_flags;
}